

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O1

FString __thiscall PNamedType::QualifiedName(PNamedType *this)

{
  FString *this_00;
  long in_RSI;
  FString FStack_18;
  
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  (this->super_PCompoundType).super_PType.super_PTypeBase.super_DObject._vptr_DObject =
       (_func_int **)0x727dbc;
  if (*(long **)(in_RSI + 0x98) != (long *)0x0) {
    (**(code **)(**(long **)(in_RSI + 0x98) + 0x38))(&FStack_18);
    FString::operator=((FString *)this,&FStack_18);
    FString::~FString(&FStack_18);
  }
  this_00 = FString::operator+=((FString *)this,"::");
  FString::operator+=(this_00,FName::NameData.NameArray[*(int *)(in_RSI + 0xa0)].Text);
  return (FString)(char *)this;
}

Assistant:

FString PNamedType::QualifiedName() const
{
	FString out;
	if (Outer != nullptr) out = Outer->QualifiedName();
	out << "::" << TypeName;
	return out;
}